

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_ellswift_xswiftec_var(secp256k1_fe *x,secp256k1_fe *u,secp256k1_fe *t)

{
  secp256k1_fe *in_RDX;
  secp256k1_fe *in_RSI;
  secp256k1_fe xd;
  secp256k1_fe xn;
  secp256k1_fe *in_stack_000000a8;
  secp256k1_fe *in_stack_000000b0;
  secp256k1_fe *in_stack_000000b8;
  secp256k1_fe *in_stack_000000c0;
  secp256k1_fe *in_stack_ffffffffffffff98;
  secp256k1_fe *in_stack_ffffffffffffffa0;
  
  secp256k1_ellswift_xswiftec_frac_var
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
  secp256k1_fe_impl_inv_var(in_RSI,in_RDX);
  secp256k1_fe_impl_mul
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(secp256k1_fe *)0x10ca77);
  return;
}

Assistant:

static void secp256k1_ellswift_xswiftec_var(secp256k1_fe *x, const secp256k1_fe *u, const secp256k1_fe *t) {
    secp256k1_fe xn, xd;
    secp256k1_ellswift_xswiftec_frac_var(&xn, &xd, u, t);
    secp256k1_fe_inv_var(&xd, &xd);
    secp256k1_fe_mul(x, &xn, &xd);
}